

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::getHessian
          (CostAttributes *this,VectorDynSize *values,MatrixDynSize *partialDerivative,string *label
          )

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  element_type *peVar4;
  long lVar5;
  ostream *poVar6;
  char *pcVar7;
  char *pcVar8;
  string *in_RCX;
  MatrixDynSize *in_RDX;
  CostAttributes *in_RDI;
  ostringstream errorTag;
  ostringstream errorMsg;
  string local_368 [32];
  string local_348 [48];
  ostringstream local_318 [376];
  ostringstream local_1a0 [376];
  string *local_28;
  MatrixDynSize *local_20;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  uVar2 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)in_RDX,uVar2);
  bVar1 = isValid(in_RDI);
  if (bVar1) {
    lVar3 = iDynTree::VectorDynSize::size();
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x34e65d);
    (*peVar4->_vptr_Selector[3])();
    lVar5 = iDynTree::MatrixDynSize::cols();
    if (lVar3 == lVar5) {
      iDynTree::MatrixDynSize::operator=(local_20,&in_RDI->hessianMatrix);
      local_1 = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::__cxx11::ostringstream::ostringstream(local_318);
      poVar6 = std::operator<<((ostream *)local_318,"costSecondPartialDerivativeWRT");
      std::operator<<(poVar6,local_28);
      poVar6 = std::operator<<((ostream *)local_1a0,"The ");
      poVar6 = std::operator<<(poVar6,local_28);
      std::operator<<(poVar6," dimension is not the one expected from the specified selector.");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("L2NormCost",pcVar7,pcVar8);
      std::__cxx11::string::~string(local_368);
      std::__cxx11::string::~string(local_348);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_318);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
  }
  else {
    iDynTree::MatrixDynSize::zero();
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool getHessian(const VectorDynSize& values, MatrixDynSize& partialDerivative, const std::string &label) {

                partialDerivative.resize(values.size(), values.size());

                if (!isValid()) {
                    partialDerivative.zero();
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg, errorTag;
                    errorTag << "costSecondPartialDerivativeWRT" << label;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", errorTag.str().c_str(), errorMsg.str().c_str());
                    return false;
                }

                partialDerivative = hessianMatrix;

                return true;

            }